

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index index)

{
  Scalar SVar1;
  ConstColXpr local_170;
  ConstRowXpr local_140;
  ConstTransposeReturnType local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>
  local_b0;
  undefined8 local_28;
  Index col;
  Index row;
  Index index_local;
  product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  *this_local;
  
  local_28 = 0;
  col = index;
  row = index;
  index_local = (Index)this;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>_>
  ::row(&local_140,
        (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>_>
         *)this,index);
  DenseBase<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_1,_-1,_false>_>
  ::transpose(&local_f8,
              (DenseBase<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false>_>
               *)&local_140);
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::col
            (&local_170,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this->m_rhs,0);
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,-1,1>const>const,1,-1,false>const>>
  ::cwiseProduct<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,3,1,true>>
            (&local_b0,&local_f8,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_> *)
             &local_170);
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>_>
                 *)&local_b0);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index index) const
  {
    const Index row = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? 0 : index;
    const Index col = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? index : 0;
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }